

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::addBuffer(CLIntercept *this,cl_mem buffer)

{
  mutex *__mutex;
  mapped_type mVar1;
  mapped_type_conflict mVar2;
  int iVar3;
  cl_int cVar4;
  mapped_type *pmVar5;
  mapped_type_conflict *pmVar6;
  undefined8 uVar7;
  size_t size;
  cl_mem local_38;
  mapped_type_conflict local_30;
  cl_mem local_28;
  
  if (buffer != (cl_mem)0x0) {
    __mutex = &this->m_Mutex;
    local_38 = buffer;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar3 != 0) {
      uVar7 = std::__throw_system_error(iVar3);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar7);
    }
    local_30 = 0;
    cVar4 = (*(this->m_Dispatch).clGetMemObjectInfo)(local_38,0x1102,8,&local_30,(size_t *)0x0);
    if (cVar4 == 0) {
      mVar1 = this->m_MemAllocNumber;
      local_28 = local_38;
      pmVar5 = std::
               map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
               ::operator[](&this->m_MemAllocNumberMap,&local_28);
      mVar2 = local_30;
      *pmVar5 = mVar1;
      pmVar6 = std::
               map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
               ::operator[](&this->m_BufferInfoMap,&local_38);
      *pmVar6 = mVar2;
      this->m_MemAllocNumber = this->m_MemAllocNumber + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void CLIntercept::addBuffer(
    cl_mem buffer )
{
    if( buffer )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        cl_int  errorCode = CL_SUCCESS;
        size_t  size = 0;

        errorCode |= dispatch().clGetMemObjectInfo(
            buffer,
            CL_MEM_SIZE,
            sizeof( size_t ),
            &size,
            NULL );

        if( errorCode == CL_SUCCESS )
        {
            m_MemAllocNumberMap[ buffer ] = m_MemAllocNumber;
            m_BufferInfoMap[ buffer ] = size;
            m_MemAllocNumber++;
        }
    }
}